

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::GetTargetFlags
          (cmLocalGenerator *this,cmLinkLineComputer *linkLineComputer,string *config,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibs,string *flags,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkFlags,string *frameworkPath,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkPath,cmGeneratorTarget *target)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  string *psVar4;
  cmValue cVar5;
  string extraLinkFlags;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  linkOpts;
  string linkLanguage;
  char *libraryLinkVariable;
  string configUpper;
  allocator<char> local_f9;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char local_b1;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_b0;
  string local_a8;
  cmComputeLinkInformation *local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  char *local_60;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_58;
  string local_50;
  
  local_b0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)linkFlags;
  local_58 = linkLibs;
  cmsys::SystemTools::UpperCase(&local_50,config);
  local_88 = cmGeneratorTarget::GetLinkInformation(target,config);
  local_60 = "CMAKE_SHARED_LINKER_FLAGS";
  (*linkLineComputer->_vptr_cmLinkLineComputer[4])(&local_80,linkLineComputer,target,config);
  TVar3 = cmGeneratorTarget::GetType(target);
  if (TVar3 < OBJECT_LIBRARY) {
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    switch(TVar3) {
    case EXECUTABLE:
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      bVar2 = std::operator!=(&local_80,"Swift");
      if (bVar2) {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"CMAKE_EXE_LINKER_FLAGS",(allocator<char> *)&local_a8);
        cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
        std::__cxx11::string::_M_assign((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::append((char *)&local_d8);
        if (local_50._M_string_length != 0) {
          pcVar1 = this->Makefile;
          cmStrCat<char_const(&)[24],std::__cxx11::string_const&>
                    (&local_f8,(char (*) [24])"CMAKE_EXE_LINKER_FLAGS_",&local_50);
          cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
          std::__cxx11::string::append((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::append((char *)&local_d8);
        }
        if (local_80._M_string_length == 0) {
          psVar4 = cmGeneratorTarget::GetName_abi_cxx11_(target);
          std::operator+(&local_f8,"CMake can not determine linker language for target: ",psVar4);
          cmSystemTools::Error(&local_f8);
          std::__cxx11::string::~string((string *)&local_f8);
          goto LAB_0027c433;
        }
        bVar2 = cmGeneratorTarget::IsWin32Executable(target,config);
        pcVar1 = this->Makefile;
        if (bVar2) {
          cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[18]>
                    (&local_f8,(char (*) [7])0x72f1a0,&local_80,(char (*) [18])"_CREATE_WIN32_EXE");
          cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
          std::__cxx11::string::append((string *)&local_d8);
        }
        else {
          cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[20]>
                    (&local_f8,(char (*) [7])0x72f1a0,&local_80,(char (*) [20])"_CREATE_CONSOLE_EXE"
                    );
          cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
          std::__cxx11::string::append((string *)&local_d8);
        }
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::append((char *)&local_d8);
        bVar2 = cmGeneratorTarget::IsExecutableWithExports(target);
        if (bVar2) {
          pcVar1 = this->Makefile;
          cmStrCat<char_const(&)[19],std::__cxx11::string_const&,char_const(&)[6]>
                    (&local_f8,(char (*) [19])"CMAKE_EXE_EXPORTS_",&local_80,(char (*) [6])0x752b93)
          ;
          cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
          std::__cxx11::string::append((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::append((char *)&local_d8);
        }
      }
      AddLanguageFlagsForLinking(this,flags,target,&local_80,config);
      if (local_88 != (cmComputeLinkInformation *)0x0) {
        OutputLinkLibraries(this,local_88,linkLineComputer,local_58,frameworkPath,linkPath);
      }
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"BUILD_SHARED_LIBS",(allocator<char> *)&local_a8);
      bVar2 = cmMakefile::IsOn(pcVar1,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if (bVar2) {
        std::operator+(&local_a8,"CMAKE_SHARED_BUILD_",&local_80);
        std::operator+(&local_f8,&local_a8,"_FLAGS");
        std::__cxx11::string::~string((string *)&local_a8);
        cmMakefile::GetSafeDefinition(this->Makefile,&local_f8);
        std::__cxx11::string::append((string *)&local_d8);
        std::__cxx11::string::append((char *)&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
      }
      GetLinkLibsCMP0065(&local_f8,this,&local_80,target);
      if (local_f8._M_string_length != 0) {
        std::__cxx11::string::append((string *)&local_d8);
        std::__cxx11::string::append((char *)&local_d8);
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"LINK_FLAGS",&local_f9)
      ;
      cVar5 = cmGeneratorTarget::GetProperty(target,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      if (cVar5.Value != (string *)0x0) {
        std::__cxx11::string::append((string *)&local_d8);
        std::__cxx11::string::append((char *)&local_d8);
      }
      if (local_50._M_string_length != 0) {
        cmStrCat<char_const(&)[12],std::__cxx11::string_const&>
                  (&local_a8,(char (*) [12])"LINK_FLAGS_",&local_50);
        cVar5 = cmGeneratorTarget::GetProperty(target,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        if (cVar5.Value != (string *)0x0) {
          std::__cxx11::string::append((string *)&local_d8);
          std::__cxx11::string::append((char *)&local_d8);
        }
      }
      if (local_d8._M_string_length != 0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x3c])(this->GlobalGenerator,&local_d8);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>(local_b0,&local_d8);
      }
      cmGeneratorTarget::GetLinkOptions
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_a8,target,config,&local_80);
      cmOutputConverter::SetLinkScriptShell
                (&this->super_cmOutputConverter,this->GlobalGenerator->UseLinkScript);
      AppendCompileOptions
                (this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_b0,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_a8,(char *)0x0);
      cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,false);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_a8);
      std::__cxx11::string::~string((string *)&local_f8);
      break;
    case STATIC_LIBRARY:
      GetStaticLibraryFlags
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_d8,this,config,&local_80,target);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_move_assign((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_b0,&local_d8);
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_d8);
      goto LAB_0027c374;
    case MODULE_LIBRARY:
      local_60 = "CMAKE_MODULE_LINKER_FLAGS";
    case SHARED_LIBRARY:
      local_d8._M_string_length = 0;
      local_d8.field_2._M_local_buf[0] = '\0';
      bVar2 = std::operator!=(&local_80,"Swift");
      if (bVar2) {
        pcVar1 = this->Makefile;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,local_60,&local_f9);
        psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_a8);
        local_b1 = ' ';
        cmStrCat<std::__cxx11::string_const&,char>(&local_f8,psVar4,&local_b1);
        std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_a8);
        if (local_50._M_string_length != 0) {
          local_a8._M_dataplus._M_p._0_1_ = 0x5f;
          cmStrCat<char_const*&,char,std::__cxx11::string_const&>
                    (&local_f8,&local_60,(char *)&local_a8,&local_50);
          cmMakefile::GetSafeDefinition(this->Makefile,&local_f8);
          std::__cxx11::string::append((string *)&local_d8);
          std::__cxx11::string::append((char *)&local_d8);
          std::__cxx11::string::~string((string *)&local_f8);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"LINK_FLAGS",(allocator<char> *)&local_a8);
      cVar5 = cmGeneratorTarget::GetProperty(target,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      if (cVar5.Value != (string *)0x0) {
        std::__cxx11::string::append((string *)&local_d8);
        std::__cxx11::string::append((char *)&local_d8);
      }
      if (local_50._M_string_length != 0) {
        cmStrCat<char_const(&)[12],std::__cxx11::string_const&>
                  (&local_f8,(char (*) [12])"LINK_FLAGS_",&local_50);
        cVar5 = cmGeneratorTarget::GetProperty(target,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        if (cVar5.Value != (string *)0x0) {
          std::__cxx11::string::append((string *)&local_d8);
          std::__cxx11::string::append((char *)&local_d8);
        }
      }
      if (local_d8._M_string_length != 0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x3c])(this->GlobalGenerator,&local_d8);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>(local_b0,&local_d8);
      }
      cmGeneratorTarget::GetLinkOptions
                ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_f8,target,config,&local_80);
      cmOutputConverter::SetLinkScriptShell
                (&this->super_cmOutputConverter,this->GlobalGenerator->UseLinkScript);
      AppendCompileOptions
                (this,(vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_b0,
                 (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_f8,(char *)0x0);
      cmOutputConverter::SetLinkScriptShell(&this->super_cmOutputConverter,false);
      if (local_88 != (cmComputeLinkInformation *)0x0) {
        OutputLinkLibraries(this,local_88,linkLineComputer,local_58,frameworkPath,linkPath);
      }
      std::
      vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_f8);
    }
    std::__cxx11::string::~string((string *)&local_d8);
  }
LAB_0027c374:
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  AppendLinkerTypeFlags(this,&local_d8,target,config,&local_80);
  AppendPositionIndependentLinkerFlags(this,&local_d8,target,config,&local_80);
  AppendIPOLinkerFlags(this,&local_d8,target,config,&local_80);
  AppendDependencyInfoLinkerFlags(this,&local_d8,target,config,&local_80);
  AppendModuleDefinitionFlag(this,&local_d8,target,linkLineComputer,config);
  if (local_d8._M_string_length != 0) {
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[0x3c])(this->GlobalGenerator,&local_d8);
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>(local_b0,&local_d8);
  }
LAB_0027c433:
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void cmLocalGenerator::GetTargetFlags(
  cmLinkLineComputer* linkLineComputer, const std::string& config,
  std::vector<BT<std::string>>& linkLibs, std::string& flags,
  std::vector<BT<std::string>>& linkFlags, std::string& frameworkPath,
  std::vector<BT<std::string>>& linkPath, cmGeneratorTarget* target)
{
  const std::string configUpper = cmSystemTools::UpperCase(config);
  cmComputeLinkInformation* pcli = target->GetLinkInformation(config);
  const char* libraryLinkVariable =
    "CMAKE_SHARED_LINKER_FLAGS"; // default to shared library

  const std::string linkLanguage =
    linkLineComputer->GetLinkerLanguage(target, config);

  switch (target->GetType()) {
    case cmStateEnums::STATIC_LIBRARY:
      linkFlags = this->GetStaticLibraryFlags(config, linkLanguage, target);
      break;
    case cmStateEnums::MODULE_LIBRARY:
      libraryLinkVariable = "CMAKE_MODULE_LINKER_FLAGS";
      CM_FALLTHROUGH;
    case cmStateEnums::SHARED_LIBRARY: {
      std::string sharedLibFlags;
      if (linkLanguage != "Swift") {
        sharedLibFlags = cmStrCat(
          this->Makefile->GetSafeDefinition(libraryLinkVariable), ' ');
        if (!configUpper.empty()) {
          std::string build = cmStrCat(libraryLinkVariable, '_', configUpper);
          sharedLibFlags += this->Makefile->GetSafeDefinition(build);
          sharedLibFlags += " ";
        }
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        sharedLibFlags += *targetLinkFlags;
        sharedLibFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          sharedLibFlags += *targetLinkFlags;
          sharedLibFlags += " ";
        }
      }

      if (!sharedLibFlags.empty()) {
        this->GetGlobalGenerator()->EncodeLiteral(sharedLibFlags);
        linkFlags.emplace_back(std::move(sharedLibFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      this->SetLinkScriptShell(this->GetGlobalGenerator()->GetUseLinkScript());
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      this->SetLinkScriptShell(false);

      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }
    } break;
    case cmStateEnums::EXECUTABLE: {
      std::string exeFlags;
      if (linkLanguage != "Swift") {
        exeFlags = this->Makefile->GetSafeDefinition("CMAKE_EXE_LINKER_FLAGS");
        exeFlags += " ";
        if (!configUpper.empty()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_LINKER_FLAGS_", configUpper));
          exeFlags += " ";
        }
        if (linkLanguage.empty()) {
          cmSystemTools::Error(
            "CMake can not determine linker language for target: " +
            target->GetName());
          return;
        }

        if (target->IsWin32Executable(config)) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_WIN32_EXE"));
          exeFlags += " ";
        } else {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_", linkLanguage, "_CREATE_CONSOLE_EXE"));
          exeFlags += " ";
        }

        if (target->IsExecutableWithExports()) {
          exeFlags += this->Makefile->GetSafeDefinition(
            cmStrCat("CMAKE_EXE_EXPORTS_", linkLanguage, "_FLAG"));
          exeFlags += " ";
        }
      }

      this->AddLanguageFlagsForLinking(flags, target, linkLanguage, config);
      if (pcli) {
        this->OutputLinkLibraries(pcli, linkLineComputer, linkLibs,
                                  frameworkPath, linkPath);
      }

      if (this->Makefile->IsOn("BUILD_SHARED_LIBS")) {
        std::string sFlagVar = "CMAKE_SHARED_BUILD_" + linkLanguage + "_FLAGS";
        exeFlags += this->Makefile->GetSafeDefinition(sFlagVar);
        exeFlags += " ";
      }

      std::string cmp0065Flags =
        this->GetLinkLibsCMP0065(linkLanguage, *target);
      if (!cmp0065Flags.empty()) {
        exeFlags += cmp0065Flags;
        exeFlags += " ";
      }

      cmValue targetLinkFlags = target->GetProperty("LINK_FLAGS");
      if (targetLinkFlags) {
        exeFlags += *targetLinkFlags;
        exeFlags += " ";
      }
      if (!configUpper.empty()) {
        targetLinkFlags =
          target->GetProperty(cmStrCat("LINK_FLAGS_", configUpper));
        if (targetLinkFlags) {
          exeFlags += *targetLinkFlags;
          exeFlags += " ";
        }
      }

      if (!exeFlags.empty()) {
        this->GetGlobalGenerator()->EncodeLiteral(exeFlags);
        linkFlags.emplace_back(std::move(exeFlags));
      }

      std::vector<BT<std::string>> linkOpts =
        target->GetLinkOptions(config, linkLanguage);
      this->SetLinkScriptShell(this->GetGlobalGenerator()->GetUseLinkScript());
      // LINK_OPTIONS are escaped.
      this->AppendCompileOptions(linkFlags, linkOpts);
      this->SetLinkScriptShell(false);
    } break;
    default:
      break;
  }

  std::string extraLinkFlags;
  this->AppendLinkerTypeFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendPositionIndependentLinkerFlags(extraLinkFlags, target, config,
                                             linkLanguage);
  this->AppendIPOLinkerFlags(extraLinkFlags, target, config, linkLanguage);
  this->AppendDependencyInfoLinkerFlags(extraLinkFlags, target, config,
                                        linkLanguage);
  this->AppendModuleDefinitionFlag(extraLinkFlags, target, linkLineComputer,
                                   config);

  if (!extraLinkFlags.empty()) {
    this->GetGlobalGenerator()->EncodeLiteral(extraLinkFlags);
    linkFlags.emplace_back(std::move(extraLinkFlags));
  }
}